

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O3

void (anonymous_namespace)::check<Imf_3_2::InputFile,Imf_3_2::TiledOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  void *pvVar7;
  size_t sVar8;
  TiledOutputFile file;
  MultiPartInputFile file_1;
  Header f;
  long *local_98;
  long lStack_90;
  long local_88 [3];
  MultiPartInputFile local_70 [16];
  TileDescription local_60 [3];
  
  local_98 = (long *)0x0;
  Imf_3_2::Header::Header
            ((Header *)local_60,0x40,0x40,1.0,(Vec2 *)&local_98,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar3 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&local_98,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar3,(Channel *)"Dummy");
  sVar8 = *(size_t *)(filename + 8);
  if (sVar8 == DAT_001efe90) {
    if (sVar8 != 0) {
      iVar2 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_0012ff7e;
    }
  }
  else {
LAB_0012ff7e:
    Imf_3_2::Header::setType((string *)local_60);
  }
  puVar4 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar4 = 2;
  local_98 = (long *)0x2000000020;
  lStack_90 = 0;
  Imf_3_2::Header::setTileDescription(local_60);
  remove("/var/tmp/badfile.exr");
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)&local_98,"/var/tmp/badfile.exr",(Header *)local_60,iVar2);
  Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&local_98);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_70,"/var/tmp/badfile.exr",iVar2,true);
  sVar8 = inputtype->_M_string_length;
  if (sVar8 == DAT_001efe90) {
    if (sVar8 == 0) {
LAB_00130134:
      sVar8 = 0;
    }
    else {
      iVar2 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_0013002f;
    }
  }
  else {
LAB_0013002f:
    Imf_3_2::MultiPartInputFile::header((int)local_70);
    puVar5 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar8 = puVar5[1];
    if (sVar8 == inputtype->_M_string_length) {
      if (sVar8 == 0) goto LAB_00130134;
      iVar2 = bcmp((void *)*puVar5,(inputtype->_M_dataplus)._M_p,sVar8);
      if (iVar2 == 0) goto LAB_001301b0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                        inputtype->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," but got ",9);
    Imf_3_2::MultiPartInputFile::header((int)local_70);
    puVar5 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)*puVar5,puVar5[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from multipart when input type was ",0x24);
    sVar8 = *(size_t *)(filename + 8);
    if (sVar8 == DAT_001efe90) {
      if (sVar8 != 0) {
        pvVar7 = *(void **)filename;
        iVar2 = bcmp(pvVar7,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
        if (iVar2 != 0) goto LAB_0013013c;
      }
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unset","");
    }
    else {
      pvVar7 = *(void **)filename;
LAB_0013013c:
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,pvVar7,sVar8 + (long)pvVar7);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_98,lStack_90);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    sVar8 = inputtype->_M_string_length;
  }
LAB_001301b0:
  if (sVar8 == DAT_001efe90) {
    if (sVar8 != 0) {
      iVar2 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_001301d4;
    }
  }
  else {
LAB_001301d4:
    Imf_3_2::MultiPartInputFile::header((int)local_70);
    puVar5 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar8 = puVar5[1];
    if (sVar8 != inputtype->_M_string_length) {
LAB_0013046e:
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::InputFile, OUT = Imf_3_2::TiledOutputFile]"
                   );
    }
    if (sVar8 != 0) {
      iVar2 = bcmp((void *)*puVar5,(inputtype->_M_dataplus)._M_p,sVar8);
      if (iVar2 != 0) goto LAB_0013046e;
    }
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_70);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile((InputFile *)local_70,"/var/tmp/badfile.exr",iVar2);
  sVar8 = inputtype->_M_string_length;
  if (sVar8 == DAT_001efe90) {
    if (sVar8 != 0) {
      iVar2 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_0013025d;
    }
    Imf_3_2::InputFile::header();
    cVar1 = Imf_3_2::Header::hasType();
    if (cVar1 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_2::InputFile::header();
    cVar1 = Imf_3_2::Header::hasType();
    if (cVar1 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::InputFile, OUT = Imf_3_2::TiledOutputFile]"
                   );
    }
    goto LAB_00130440;
  }
LAB_0013025d:
  Imf_3_2::InputFile::header();
  puVar5 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  sVar8 = puVar5[1];
  if (sVar8 == inputtype->_M_string_length) {
    if (sVar8 == 0) goto LAB_00130440;
    iVar2 = bcmp((void *)*puVar5,(inputtype->_M_dataplus)._M_p,sVar8);
    if (iVar2 == 0) goto LAB_00130440;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                      inputtype->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," but got ",9);
  Imf_3_2::InputFile::header();
  puVar5 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)*puVar5,puVar5[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," when input type was ",0x15);
  sVar8 = *(size_t *)(filename + 8);
  if (sVar8 == DAT_001efe90) {
    if (sVar8 != 0) {
      pvVar7 = *(void **)filename;
      iVar2 = bcmp(pvVar7,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_001303d0;
    }
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unset","");
  }
  else {
    pvVar7 = *(void **)filename;
LAB_001303d0:
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,pvVar7,sVar8 + (long)pvVar7);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_98,lStack_90);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
LAB_00130440:
  Imf_3_2::InputFile::~InputFile((InputFile *)local_70);
  remove("/var/tmp/badfile.exr");
  Imf_3_2::Header::~Header((Header *)local_60);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}